

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>::
InterpolationSequenceRecord
          (InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution> *this
          ,InterpolationRecord *interpolation,
          vector<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
          *sequence)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  uVar1 = *(undefined8 *)
           &(interpolation->super_InterpolationBase).metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>;
  lVar2 = ((_Head_base<4UL,_long,_false> *)
          ((long)&(interpolation->super_InterpolationBase).metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl;
  lVar3 = ((_Head_base<3UL,_long,_false> *)
          ((long)&(interpolation->super_InterpolationBase).metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  lVar4 = (interpolation->super_InterpolationBase).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
          _M_head_impl;
  dVar5 = (interpolation->super_InterpolationBase).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Head_base<0UL,_double,_false>._M_head_impl;
  (this->interpolation_).super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (interpolation->super_InterpolationBase).metadata.fields.
                 super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                 super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                 super__Head_base<1UL,_double,_false>._M_head_impl;
  (this->interpolation_).super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = dVar5;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->interpolation_).super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x10))->_M_head_impl = lVar3;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->interpolation_).super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x18))->_M_head_impl = lVar4;
  *(undefined8 *)
   &(this->interpolation_).super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long> = uVar1;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->interpolation_).super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 8))->_M_head_impl = lVar2;
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->interpolation_).super_InterpolationBase.boundaryIndices,
             &(interpolation->super_InterpolationBase).boundaryIndices);
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->interpolation_).super_InterpolationBase.interpolationSchemeIndices,
             &(interpolation->super_InterpolationBase).interpolationSchemeIndices);
  std::
  vector<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
  ::vector(&this->sequence_,sequence);
  verifyNZ(*(uint *)((this->interpolation_).super_InterpolationBase.boundaryIndices.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_finish + -1),
           (int)((ulong)((long)(sequence->
                               super__Vector_base<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(sequence->
                              super__Vector_base<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 4) * 0x38e38e39);
  return;
}

Assistant:

InterpolationSequenceRecord ( InterpolationRecord&& interpolation,
                              std::vector< Component >&& sequence ) :
  interpolation_( interpolation ),
  sequence_( sequence ) {

  verifyNZ( this->tab2().NZ(), sequence.size() );
  validateSequence( sequence );
}